

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSequence.hpp
# Opt level: O1

vector<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_> * __thiscall
njoy::ENDFtk::
readSequence<njoy::ENDFtk::DirectoryRecord,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
           *__return_storage_ptr__,ENDFtk *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int size)

{
  int iVar1;
  int local_38;
  int local_34;
  
  iVar1 = MT;
  local_34 = (int)lineNumber;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = MAT;
  std::vector<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>::
  reserve(__return_storage_ptr__,(long)MT);
  iVar1 = iVar1 + 1;
  while (iVar1 = iVar1 + -1, iVar1 != 0) {
    std::vector<njoy::ENDFtk::DirectoryRecord,std::allocator<njoy::ENDFtk::DirectoryRecord>>::
    emplace_back<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&,int&,int&,int&>
              ((vector<njoy::ENDFtk::DirectoryRecord,std::allocator<njoy::ENDFtk::DirectoryRecord>>
                *)__return_storage_ptr__,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,&local_34,&local_38,&MF);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< Component >
  readSequence( Iterator& begin,
                const Iterator& end,
                long& lineNumber,
                int MAT,
                int MF,
                int MT,
                int size ) {

    std::vector< Component > sequence;
    sequence.reserve( size );

    while ( size-- ) {

      sequence.emplace_back( begin, end, lineNumber, MAT, MF, MT );
    }

    return sequence;
  }